

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
          (QMovableArrayOps<ProString> *this,qsizetype i,ProString *args)

{
  ProString **ppPVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  ProString tmp;
  Inserter local_80;
  undefined1 local_58 [32];
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00146438:
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ProString::ProString((ProString *)local_58,args);
    bVar5 = (this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.size != 0;
    QArrayDataPointer<ProString>::detachAndGrow
              ((QArrayDataPointer<ProString> *)this,(uint)(i == 0 && bVar5),1,(ProString **)0x0,
               (QArrayDataPointer<ProString> *)0x0);
    if (i == 0 && bVar5) {
      ProString::ProString
                ((this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr +
                 -1,(ProString *)local_58);
      ppPVar1 = &(this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr;
      *ppPVar1 = *ppPVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_80.displaceTo =
           (this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr;
      local_80.displaceFrom = local_80.displaceTo + i;
      local_80.displaceTo = local_80.displaceTo + i + 1;
      local_80.nInserts = 1;
      local_80.bytes =
           ((this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.size - i) *
           0x30;
      local_80.data = (QArrayDataPointer<ProString> *)this;
      memmove(local_80.displaceTo,local_80.displaceFrom,local_80.bytes);
      ProString::ProString(local_80.displaceFrom,(ProString *)local_58);
      local_80.displaceFrom = local_80.displaceFrom + 1;
      Inserter::~Inserter(&local_80);
    }
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.
                      ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      ProString::ProString
                ((this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr +
                 lVar4,args);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((ProString *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr))
      goto LAB_00146438;
      ProString::ProString
                ((this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr +
                 -1,args);
      ppPVar1 = &(this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.ptr;
      *ppPVar1 = *ppPVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<ProString>).super_QArrayDataPointer<ProString>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }